

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

void __thiscall capnp::_::ReaderArena::ReaderArena(ReaderArena *this,MessageReader *message)

{
  ArrayPtr<const_capnp::word> firstSegment;
  int iVar1;
  undefined4 extraout_var;
  size_t extraout_RDX;
  MessageReader *message_local;
  ReaderArena *this_local;
  
  iVar1 = (*message->_vptr_MessageReader[2])(message,0);
  firstSegment.ptr._4_4_ = extraout_var;
  firstSegment.ptr._0_4_ = iVar1;
  firstSegment.size_ = extraout_RDX;
  ReaderArena(this,message,firstSegment);
  return;
}

Assistant:

ReaderArena::ReaderArena(MessageReader* message)
    : ReaderArena(message, message->getSegment(0)) {}